

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::gatherv<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *data,size_t size,int root,comm *comm)

{
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm *comm_local;
  size_t sStack_20;
  int root_local;
  size_t size_local;
  unsigned_long *data_local;
  
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  sStack_20 = size;
  size_local = (size_t)data;
  data_local = (unsigned_long *)__return_storage_ptr__;
  gather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
             &stack0xffffffffffffffe0,root,comm);
  gatherv<unsigned_long>
            (__return_storage_ptr__,(unsigned_long *)size_local,sStack_20,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,root,
             (comm *)recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = gather(size, root, comm);
    return gatherv(data, size, recv_sizes, root, comm);
}